

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t repTextReplace(UText *ut,int64_t start,int64_t limit,UChar *src,int32_t length,
                      UErrorCode *status)

{
  Replaceable *this;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t newIndexPos;
  int32_t lengthDelta;
  int32_t newLength;
  ConstChar16Ptr local_a0;
  undefined1 local_98 [8];
  UnicodeString replStr;
  uint local_50;
  int32_t limit32;
  int32_t start32;
  int32_t oldLength;
  Replaceable *rep;
  UErrorCode *status_local;
  int32_t length_local;
  UChar *src_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  this = (Replaceable *)ut->context;
  src_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((src == (UChar *)0x0) && (length != 0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local._4_4_ = 0;
    }
    else {
      iVar3 = icu_63::Replaceable::length(this);
      if ((long)src_local < limit_local) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
        ut_local._4_4_ = 0;
      }
      else {
        local_50 = pinIndex(&limit_local,(long)iVar3);
        replStr.fUnion._52_4_ = pinIndex((int64_t *)&src_local,(long)iVar3);
        if ((int)local_50 < iVar3) {
          cVar2 = icu_63::Replaceable::charAt(this,local_50);
          if (((cVar2 & 0xfc00U) == 0xdc00) && (0 < (int)local_50)) {
            cVar2 = icu_63::Replaceable::charAt(this,local_50 - 1);
            if ((cVar2 & 0xfc00U) == 0xd800) {
              local_50 = local_50 - 1;
            }
          }
        }
        if ((int)replStr.fUnion._52_4_ < iVar3) {
          cVar2 = icu_63::Replaceable::charAt(this,replStr.fUnion._52_4_ + -1);
          if ((cVar2 & 0xfc00U) == 0xd800) {
            cVar2 = icu_63::Replaceable::charAt(this,replStr.fUnion._52_4_);
            if ((cVar2 & 0xfc00U) == 0xdc00) {
              replStr.fUnion._52_4_ = replStr.fUnion._52_4_ + 1;
            }
          }
        }
        icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_a0,src);
        icu_63::UnicodeString::UnicodeString
                  ((UnicodeString *)local_98,(byte)((uint)length >> 0x1f),&local_a0,length);
        icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_a0);
        (*(this->super_UObject)._vptr_UObject[4])
                  (this,(ulong)local_50,(ulong)(uint)replStr.fUnion._52_4_,local_98);
        iVar4 = icu_63::Replaceable::length(this);
        if ((long)(int)local_50 < *(long *)(start_local + 0x10)) {
          invalidateChunk((UText *)start_local);
        }
        repTextAccess((UText *)start_local,(long)(replStr.fUnion._52_4_ + (iVar4 - iVar3)),'\x01');
        ut_local._4_4_ = iVar4 - iVar3;
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_98);
      }
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
repTextReplace(UText *ut,
               int64_t start, int64_t limit,
               const UChar *src, int32_t length,
               UErrorCode *status) {
    Replaceable *rep=(Replaceable *)ut->context;
    int32_t oldLength;

    if(U_FAILURE(*status)) {
        return 0;
    }
    if(src==NULL && length!=0) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    oldLength=rep->length(); // will subtract from new length
    if(start>limit ) {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t start32 = pinIndex(start, oldLength);
    int32_t limit32 = pinIndex(limit, oldLength);

    // Snap start & limit to code point boundaries.
    if (start32<oldLength && U16_IS_TRAIL(rep->charAt(start32)) &&
        start32>0 && U16_IS_LEAD(rep->charAt(start32-1)))
    {
            start32--;
    }
    if (limit32<oldLength && U16_IS_LEAD(rep->charAt(limit32-1)) &&
        U16_IS_TRAIL(rep->charAt(limit32)))
    {
            limit32++;
    }

    // Do the actual replace operation using methods of the Replaceable class
    UnicodeString replStr((UBool)(length<0), src, length); // read-only alias
    rep->handleReplaceBetween(start32, limit32, replStr);
    int32_t newLength = rep->length();
    int32_t lengthDelta = newLength - oldLength;

    // Is the UText chunk buffer OK?
    if (ut->chunkNativeLimit > start32) {
        // this replace operation may have impacted the current chunk.
        // invalidate it, which will force a reload on the next access.
        invalidateChunk(ut);
    }

    // set the iteration position to the end of the newly inserted replacement text.
    int32_t newIndexPos = limit32 + lengthDelta;
    repTextAccess(ut, newIndexPos, TRUE);

    return lengthDelta;
}